

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::DoToolbar(CEditor *this,CUIRect ToolBar)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  IInput *pIVar8;
  int64 iVar9;
  CLayer **ppCVar10;
  CLayer *this_00;
  CLayer *pCVar11;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  CLayerTiles *pT;
  int i_5;
  CQuad *q;
  int AddY;
  int AddX;
  CLayerGroup *g;
  CLayerQuads *pQLayer;
  int i_4;
  int i_3;
  int i_2;
  bool TileLayer;
  int i_1;
  int i;
  int Enabled;
  CUIRect Button;
  CUIRect TB_Bottom;
  CUIRect TB_Top;
  float Mapping [4];
  CUIRect *in_stack_fffffffffffffef8;
  char *pcVar12;
  undefined4 uVar13;
  CUIRect *pLeft;
  code *in_stack_ffffffffffffff00;
  float fVar15;
  undefined8 uVar14;
  CEditor *in_stack_ffffffffffffff08;
  char *this_01;
  float in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int iVar16;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  CEditor *pCVar19;
  int local_a4;
  CQuad *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  CLayerGroup *in_stack_ffffffffffffff70;
  int local_7c;
  float local_78;
  int local_74;
  int local_6c;
  int local_68;
  float local_18;
  float local_14;
  float in_stack_fffffffffffffff0;
  float local_c;
  long lVar20;
  
  lVar20 = *(long *)(in_FS_OFFSET + 0x28);
  CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff08,
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8,
                     (CUIRect *)0x1ece35);
  CUIRect::HSplitBottom
            ((CUIRect *)in_stack_ffffffffffffff08,(float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
             in_stack_fffffffffffffef8,(CUIRect *)0x1ece51);
  CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff08,
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8,
                     (CUIRect *)0x1ece6d);
  pIVar8 = Input(in_RDI);
  uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x6f,0);
  if ((uVar2 & 1) != 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
    if ((uVar2 & 1) == 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
      if ((uVar2 & 1) == 0) goto LAB_001ecf60;
    }
    if (in_RDI->m_Dialog == 0) {
      uVar2 = (*(in_RDI->super_IEditor).super_IInterface._vptr_IInterface[4])();
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffef8 = (CUIRect *)0x26892c;
        in_stack_ffffffffffffff00 = CallbackOpenMap;
        pCVar19 = in_RDI;
        InvokeFileDialog((CEditor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (char *)in_RDI,(char *)CallbackOpenMap,
                         (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (_func_void_char_ptr_int_void_ptr *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        in_stack_ffffffffffffff08 = in_RDI;
        in_RDI = pCVar19;
      }
      else if (in_RDI->m_PopupEventWasActivated == 0) {
        in_RDI->m_PopupEventType = 1;
        in_RDI->m_PopupEventActivated = 1;
      }
    }
  }
LAB_001ecf60:
  pIVar8 = Input(in_RDI);
  uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x73,0);
  if ((uVar2 & 1) != 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
    if ((uVar2 & 1) == 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
      if ((uVar2 & 1) == 0) goto LAB_001ed07b;
    }
    if (in_RDI->m_Dialog == 0) {
      if ((in_RDI->m_aFileName[0] == '\0') || ((in_RDI->m_ValidSaveFilename & 1U) == 0)) {
        in_stack_fffffffffffffef8 = (CUIRect *)0x26892c;
        in_stack_ffffffffffffff00 = (code *)0x0;
        pCVar19 = in_RDI;
        InvokeFileDialog((CEditor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (char *)in_RDI,(char *)CallbackSaveMap,
                         (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (_func_void_char_ptr_int_void_ptr *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        in_stack_ffffffffffffff08 = in_RDI;
        in_RDI = pCVar19;
      }
      else if (in_RDI->m_PopupEventWasActivated == 0) {
        str_copy((char *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,0);
        in_RDI->m_PopupEventType = 4;
        in_RDI->m_PopupEventActivated = 1;
      }
    }
  }
LAB_001ed07b:
  fVar15 = (float)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,in_stack_fffffffffffffef8,
                      (CUIRect *)0x1ed09b);
  pcVar12 = "[ctrl+h] Toggle High Detail";
  iVar3 = DoButton_Editor((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x68,0);
    if ((uVar2 & 1) != 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
      if ((uVar2 & 1) == 0) {
        pIVar8 = Input(in_RDI);
        uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
        if ((uVar2 & 1) == 0) goto LAB_001ed14a;
      }
      goto LAB_001ed133;
    }
  }
  else {
LAB_001ed133:
    in_RDI->m_ShowDetail = (bool)((in_RDI->m_ShowDetail ^ 0xffU) & 1);
  }
LAB_001ed14a:
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed166);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed186);
  pcVar12 = "[ctrl+m] Toggle animation";
  iVar3 = DoButton_Editor((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x6d,0);
    if ((uVar2 & 1) != 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
      if ((uVar2 & 1) == 0) {
        pIVar8 = Input(in_RDI);
        uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
        if ((uVar2 & 1) == 0) goto LAB_001ed244;
      }
      goto LAB_001ed21e;
    }
  }
  else {
LAB_001ed21e:
    iVar9 = time_get();
    in_RDI->m_AnimateStart = iVar9;
    in_RDI->m_Animate = (bool)((in_RDI->m_Animate ^ 0xffU) & 1);
  }
LAB_001ed244:
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed260);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed280);
  pcVar12 = "[ctrl+p] Toggles proof borders. These borders represent what a player maximum can see."
  ;
  iVar3 = DoButton_Editor((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x70,0);
    if ((uVar2 & 1) != 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
      if ((uVar2 & 1) == 0) {
        pIVar8 = Input(in_RDI);
        uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
        if ((uVar2 & 1) == 0) goto LAB_001ed32f;
      }
      goto LAB_001ed318;
    }
  }
  else {
LAB_001ed318:
    in_RDI->m_ProofBorders = (bool)((in_RDI->m_ProofBorders ^ 0xffU) & 1);
  }
LAB_001ed32f:
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed34b);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed36b);
  pcVar12 = "[ctrl+i] Show tile information";
  iVar3 = DoButton_Editor((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x69,0);
    if ((uVar2 & 1) != 0) {
      pIVar8 = Input(in_RDI);
      uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x160);
      if ((uVar2 & 1) == 0) {
        pIVar8 = Input(in_RDI);
        uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x164);
        if ((uVar2 & 1) == 0) goto LAB_001ed424;
      }
      goto LAB_001ed403;
    }
  }
  else {
LAB_001ed403:
    in_RDI->m_ShowTileInfo = (bool)((in_RDI->m_ShowTileInfo ^ 0xffU) & 1);
    in_RDI->m_ShowEnvelopePreview = 0;
  }
LAB_001ed424:
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed440);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed460);
  pcVar12 = "[NumPad-] Zoom out";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 != 0) {
    in_RDI->m_ZoomLevel = in_RDI->m_ZoomLevel + 0x32;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed4da);
  pcVar12 = "[NumPad*] Zoom to normal and remove editor offset";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 != 0) {
    in_RDI->m_EditorOffsetX = 0.0;
    in_RDI->m_EditorOffsetY = 0.0;
    in_RDI->m_ZoomLevel = 100;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed565);
  pcVar12 = "[NumPad+] Zoom in";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 != 0) {
    in_RDI->m_ZoomLevel = in_RDI->m_ZoomLevel + -0x32;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed5db);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed5fb);
  pcVar12 = "Increase animation speed";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 != 0) {
    in_RDI->m_AnimateSpeed = in_RDI->m_AnimateSpeed + 0.5;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed67e);
  pcVar12 = "Normal animation speed";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 != 0) {
    in_RDI->m_AnimateSpeed = 1.0;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed6f9);
  pcVar12 = "Decrease animation speed";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if ((iVar3 != 0) && (0.5 < in_RDI->m_AnimateSpeed)) {
    in_RDI->m_AnimateSpeed = in_RDI->m_AnimateSpeed - 0.5;
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed79c);
  CLayerGroup::IsEmpty((CLayerGroup *)0x1ed7ad);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed7e3);
  pcVar12 = "[N] Flip brush horizontal";
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x6e,0);
    if ((uVar2 & 1) != 0) goto LAB_001ed84d;
  }
  else {
LAB_001ed84d:
    local_68 = 0;
    while (in_stack_ffffffffffffff44 = local_68,
          iVar3 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(in_RDI->m_Brush).m_lLayers),
          in_stack_ffffffffffffff44 < iVar3) {
      ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                           (&(in_RDI->m_Brush).m_lLayers,local_68);
      (*(*ppCVar10)->_vptr_CLayer[7])();
      local_68 = local_68 + 1;
    }
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,fVar15,(CUIRect *)pcVar12,
                      (CUIRect *)0x1ed8dc);
  pcVar12 = "[M] Flip brush vertical";
  uVar14 = CONCAT44(fVar15,10);
  iVar3 = DoButton_Ex((CEditor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar3 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x6d,0);
    if ((uVar2 & 1) != 0) goto LAB_001ed946;
  }
  else {
LAB_001ed946:
    local_6c = 0;
    while (in_stack_ffffffffffffff40 = local_6c,
          iVar3 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(in_RDI->m_Brush).m_lLayers),
          in_stack_ffffffffffffff40 < iVar3) {
      ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                           (&(in_RDI->m_Brush).m_lLayers,local_6c);
      (*(*ppCVar10)->_vptr_CLayer[8])();
      local_6c = local_6c + 1;
    }
  }
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,(float)((ulong)uVar14 >> 0x20),
                      (CUIRect *)pcVar12,(CUIRect *)0x1ed9d5);
  CUIRect::VSplitLeft((CUIRect *)in_stack_ffffffffffffff08,(float)((ulong)uVar14 >> 0x20),
                      (CUIRect *)pcVar12,(CUIRect *)0x1ed9f5);
  bVar1 = false;
  local_74 = 0;
  while( true ) {
    iVar3 = local_74;
    iVar4 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(in_RDI->m_Brush).m_lLayers);
    fVar15 = (float)((ulong)uVar14 >> 0x20);
    uVar13 = (undefined4)((ulong)pcVar12 >> 0x20);
    if (iVar4 <= iVar3) break;
    ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                         (&(in_RDI->m_Brush).m_lLayers,local_74);
    fVar15 = (float)((ulong)uVar14 >> 0x20);
    uVar13 = (undefined4)((ulong)pcVar12 >> 0x20);
    if ((*ppCVar10)->m_Type == 2) {
      bVar1 = true;
      DoToolbar::s_RotationAmount = maximum<int>(0x5a,(DoToolbar::s_RotationAmount / 0x5a) * 0x5a);
      break;
    }
    local_74 = local_74 + 1;
  }
  iVar4 = 1;
  if (bVar1) {
    iVar4 = 0x5a;
  }
  uVar5 = 1;
  if (bVar1) {
    uVar5 = 0x5a;
  }
  uVar17 = 0x40000000;
  uVar18 = 0x41200000;
  if (!bVar1) {
    uVar18 = 0x40000000;
  }
  pLeft = (CUIRect *)CONCAT44(uVar13,0x167);
  this_01 = 
  "Rotation of the brush in degrees. Use left mouse button to drag and change the value. Hold shift to be more precise."
  ;
  iVar16 = DoToolbar::s_RotationAmount;
  DoToolbar::s_RotationAmount =
       UiDoValueSelector(in_RDI,(void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),(CUIRect *)CONCAT44(iVar3,uVar18),
                         (char *)CONCAT44(0x40000000,uVar5),iVar4,DoToolbar::s_RotationAmount,
                         (int)in_stack_fffffffffffffff0,(int)lVar20,in_stack_ffffffffffffff24,
                         unaff_retaddr);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,pLeft,(CUIRect *)0x1edb80);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,pLeft,(CUIRect *)0x1edba0);
  pcVar12 = "[R] Rotates the brush counter clockwise";
  iVar6 = DoButton_Ex((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                      (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar6 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x72,0);
    if ((uVar2 & 1) != 0) goto LAB_001edc0d;
  }
  else {
LAB_001edc0d:
    local_78 = 0.0;
    while (in_stack_ffffffffffffff24 = local_78,
          iVar6 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(in_RDI->m_Brush).m_lLayers),
          (int)in_stack_ffffffffffffff24 < iVar6) {
      ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                           (&(in_RDI->m_Brush).m_lLayers,(int)local_78);
      (*(*ppCVar10)->_vptr_CLayer[9])
                (((float)-DoToolbar::s_RotationAmount / 360.0) * 3.1415927 * 2.0);
      local_78 = (float)((int)local_78 + 1);
    }
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1edccf);
  pcVar12 = "[T] Rotates the brush clockwise";
  uVar14 = CONCAT44(fVar15,10);
  iVar6 = DoButton_Ex((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                      (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff10);
  if (iVar6 == 0) {
    pIVar8 = Input(in_RDI);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0x74,0);
    if ((uVar2 & 1) != 0) goto LAB_001edd3c;
  }
  else {
LAB_001edd3c:
    local_7c = 0;
    while (in_stack_ffffffffffffff20 = local_7c,
          iVar6 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(in_RDI->m_Brush).m_lLayers),
          in_stack_ffffffffffffff20 < iVar6) {
      ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                           (&(in_RDI->m_Brush).m_lLayers,local_7c);
      (*(*ppCVar10)->_vptr_CLayer[9])
                (((float)DoToolbar::s_RotationAmount / 360.0) * 3.1415927 * 2.0);
      local_7c = local_7c + 1;
    }
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,(float)((ulong)uVar14 >> 0x20),(CUIRect *)pcVar12,
                      (CUIRect *)0x1eddfa);
  CUIRect::VSplitLeft((CUIRect *)this_01,(float)((ulong)uVar14 >> 0x20),(CUIRect *)pcVar12,
                      (CUIRect *)0x1ede1a);
  this_00 = GetSelectedLayerType((CEditor *)this_01,(int)((ulong)uVar14 >> 0x20),(int)uVar14);
  pcVar12 = "Adds a new quad";
  iVar6 = DoButton_Editor((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                          (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if ((iVar6 != 0) && (this_00 != (CLayer *)0x0)) {
    in_stack_ffffffffffffff70 = GetSelectedGroup((CEditor *)this_01);
    CLayerGroup::Mapping
              ((CLayerGroup *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (float *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff6c = (float)f2fx(local_18 + (in_stack_fffffffffffffff0 - local_18) / 2.0)
    ;
    in_stack_ffffffffffffff68 = f2fx(local_14 + (local_c - local_14) / 2.0);
    in_stack_ffffffffffffff60 = CLayerQuads::NewQuad((CLayerQuads *)CONCAT44(iVar4,iVar16));
    for (local_a4 = 0; local_a4 < 5; local_a4 = local_a4 + 1) {
      in_stack_ffffffffffffff60->m_aPoints[local_a4].x =
           (int)in_stack_ffffffffffffff6c + in_stack_ffffffffffffff60->m_aPoints[local_a4].x;
      in_stack_ffffffffffffff60->m_aPoints[local_a4].y =
           in_stack_ffffffffffffff68 + in_stack_ffffffffffffff60->m_aPoints[local_a4].y;
    }
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,(float)((ulong)uVar14 >> 0x20),(CUIRect *)pcVar12,
                      (CUIRect *)0x1edf94);
  pCVar11 = GetSelectedLayerType((CEditor *)this_01,(int)((ulong)uVar14 >> 0x20),(int)uVar14);
  fVar15 = (float)((ulong)uVar14 >> 0x20);
  pcVar12 = "Adds border tiles";
  iVar6 = DoButton_Editor((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                          (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if ((iVar6 != 0) && (pCVar11 != (CLayer *)0x0)) {
    DoMapBorder((CEditor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee020);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee040);
  uVar2 = in_stack_ffffffffffffff1c & 0xffffff;
  if ((in_RDI->m_WorldOffsetX != 0.0) || (NAN(in_RDI->m_WorldOffsetX))) {
    uVar2 = CONCAT13(in_RDI->m_WorldOffsetY != 0.0,(int3)in_stack_ffffffffffffff1c);
  }
  pcVar12 = "[HOME] Restore map focus";
  iVar6 = DoButton_Editor((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                          (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar6 == 0) {
    if (in_RDI->m_EditBoxActive != 0) goto LAB_001ee10b;
    pIVar8 = Input(in_RDI);
    uVar7 = (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0xca,0);
    if ((uVar7 & 1) == 0) goto LAB_001ee10b;
  }
  in_RDI->m_WorldOffsetX = 0.0;
  in_RDI->m_WorldOffsetY = 0.0;
LAB_001ee10b:
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee127);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee147);
  pcVar12 = "Toggle Grid";
  iVar6 = DoButton_Editor((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                          (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar6 != 0) {
    in_RDI->m_GridActive = (bool)((in_RDI->m_GridActive ^ 0xffU) & 1);
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee1b8);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee1d8);
  pcVar12 = "Decrease grid";
  iVar6 = DoButton_Ex((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                      (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14
                      ,(char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff10);
  if ((iVar6 != 0) && (1 < in_RDI->m_GridFactor)) {
    in_RDI->m_GridFactor = in_RDI->m_GridFactor + -1;
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee262);
  pcVar12 = "Normal grid";
  iVar6 = DoButton_Ex((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                      (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14
                      ,(char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff10);
  if (iVar6 != 0) {
    in_RDI->m_GridFactor = 1;
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee2d7);
  pcVar12 = "Increase grid";
  iVar6 = DoButton_Ex((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                      (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                      (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14
                      ,(char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff10);
  if ((iVar6 != 0) && (in_RDI->m_GridFactor < 0xf)) {
    in_RDI->m_GridFactor = in_RDI->m_GridFactor + 1;
  }
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee35d);
  CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee37d);
  pcVar12 = "Pick color from view";
  iVar3 = DoButton_Editor((CEditor *)CONCAT44(iVar3,uVar18),(void *)CONCAT44(uVar17,uVar5),
                          (char *)CONCAT44(iVar4,iVar16),(int)in_stack_ffffffffffffff24,
                          (CUIRect *)CONCAT44(uVar2,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff60);
  if (iVar3 != 0) {
    if (in_RDI->m_MouseEdMode == 1) {
      in_RDI->m_MouseEdMode = 0;
    }
    else {
      in_RDI->m_MouseEdMode = 1;
    }
  }
  if (0.0 < (in_RDI->m_SelectedColor).field_3.w) {
    CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee420);
    CUIRect::VSplitLeft((CUIRect *)this_01,fVar15,(CUIRect *)pcVar12,(CUIRect *)0x1ee440);
    CUIRect::Draw((CUIRect *)this_00,(vec4 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                  in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::DoToolbar(CUIRect ToolBar)
{
	CUIRect TB_Top, TB_Bottom;
	CUIRect Button;

	ToolBar.HSplitTop(ToolBar.h/2.0f, &TB_Top, &TB_Bottom);

	TB_Top.HSplitBottom(2.5f, &TB_Top, 0);
	TB_Bottom.HSplitTop(2.5f, 0, &TB_Bottom);

	// ctrl+o to open
	if(Input()->KeyPress(KEY_O) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL)) && m_Dialog == DIALOG_NONE)
	{
		if(HasUnsavedData())
		{
			if(!m_PopupEventWasActivated)
			{
				m_PopupEventType = POPEVENT_LOAD;
				m_PopupEventActivated = true;
			}
		}
		else
			InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", CallbackOpenMap, this);
	}

	// ctrl+s to save
	if(Input()->KeyPress(KEY_S) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL)) && m_Dialog == DIALOG_NONE)
	{
		if(m_aFileName[0] && m_ValidSaveFilename)
		{
			if(!m_PopupEventWasActivated)
			{
				str_copy(m_aFileSaveName, m_aFileName, sizeof(m_aFileSaveName));
				m_PopupEventType = POPEVENT_SAVE;
				m_PopupEventActivated = true;
			}
		}
		else
			InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", CallbackSaveMap, this);
	}

	// detail button
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_HqButton = 0;
	if(DoButton_Editor(&s_HqButton, "HD", m_ShowDetail, &Button, 0, "[ctrl+h] Toggle High Detail") ||
		(Input()->KeyPress(KEY_H) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ShowDetail = !m_ShowDetail;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// animation button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_AnimateButton = 0;
	if(DoButton_Editor(&s_AnimateButton, "Anim", m_Animate, &Button, 0, "[ctrl+m] Toggle animation") ||
		(Input()->KeyPress(KEY_M) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_AnimateStart = time_get();
		m_Animate = !m_Animate;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// proof button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_ProofButton = 0;
	if(DoButton_Editor(&s_ProofButton, "Proof", m_ProofBorders, &Button, 0, "[ctrl+p] Toggles proof borders. These borders represent what a player maximum can see.") ||
		(Input()->KeyPress(KEY_P) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ProofBorders = !m_ProofBorders;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// tile info button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_TileInfoButton = 0;
	if(DoButton_Editor(&s_TileInfoButton, "Info", m_ShowTileInfo, &Button, 0, "[ctrl+i] Show tile information") ||
		(Input()->KeyPress(KEY_I) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ShowTileInfo = !m_ShowTileInfo;
		m_ShowEnvelopePreview = SHOWENV_NONE;
	}

	TB_Top.VSplitLeft(15.0f, 0, &TB_Top);

	// zoom group
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomOutButton = 0;
	if(DoButton_Ex(&s_ZoomOutButton, "ZO", 0, &Button, 0, "[NumPad-] Zoom out", CUIRect::CORNER_L))
		m_ZoomLevel += 50;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomNormalButton = 0;
	if(DoButton_Ex(&s_ZoomNormalButton, "1:1", 0, &Button, 0, "[NumPad*] Zoom to normal and remove editor offset", 0))
	{
		m_EditorOffsetX = 0;
		m_EditorOffsetY = 0;
		m_ZoomLevel = 100;
	}

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomInButton = 0;
	if(DoButton_Ex(&s_ZoomInButton, "ZI", 0, &Button, 0, "[NumPad+] Zoom in", CUIRect::CORNER_R))
		m_ZoomLevel -= 50;

	TB_Top.VSplitLeft(10.0f, 0, &TB_Top);

	// animation speed
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimFasterButton = 0;
	if(DoButton_Ex(&s_AnimFasterButton, "A+", 0, &Button, 0, "Increase animation speed", CUIRect::CORNER_L))
		m_AnimateSpeed += 0.5f;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimNormalButton = 0;
	if(DoButton_Ex(&s_AnimNormalButton, "1", 0, &Button, 0, "Normal animation speed", 0))
		m_AnimateSpeed = 1.0f;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimSlowerButton = 0;
	if(DoButton_Ex(&s_AnimSlowerButton, "A-", 0, &Button, 0, "Decrease animation speed", CUIRect::CORNER_R))
	{
		if(m_AnimateSpeed > 0.5f)
			m_AnimateSpeed -= 0.5f;
	}

	TB_Top.VSplitLeft(10.0f, &Button, &TB_Top);


	// brush manipulation
	{
		int Enabled = m_Brush.IsEmpty()?-1:0;

		// flip buttons
		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_FlipXButton = 0;
		if(DoButton_Ex(&s_FlipXButton, "X/X", Enabled, &Button, 0, "[N] Flip brush horizontal", CUIRect::CORNER_L) || Input()->KeyPress(KEY_N))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushFlipX();
		}

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_FlipyButton = 0;
		if(DoButton_Ex(&s_FlipyButton, "Y/Y", Enabled, &Button, 0, "[M] Flip brush vertical", CUIRect::CORNER_R) || Input()->KeyPress(KEY_M))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushFlipY();
		}

		// rotate buttons
		TB_Top.VSplitLeft(15.0f, &Button, &TB_Top);

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_RotationAmount = 90;
		bool TileLayer = false;
		// check for tile layers in brush selection
		for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
			if(m_Brush.m_lLayers[i]->m_Type == LAYERTYPE_TILES)
			{
				TileLayer = true;
				s_RotationAmount = maximum(90, (s_RotationAmount/90)*90);
				break;
			}
		s_RotationAmount = UiDoValueSelector(&s_RotationAmount, &Button, "", s_RotationAmount, TileLayer?90:1, 359, TileLayer?90:1, TileLayer?10.0f:2.0f, "Rotation of the brush in degrees. Use left mouse button to drag and change the value. Hold shift to be more precise.");

		TB_Top.VSplitLeft(5.0f, &Button, &TB_Top);
		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_CcwButton = 0;
		if(DoButton_Ex(&s_CcwButton, "CCW", Enabled, &Button, 0, "[R] Rotates the brush counter clockwise", CUIRect::CORNER_L) || Input()->KeyPress(KEY_R))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushRotate(-s_RotationAmount/360.0f*pi*2);
		}

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_CwButton = 0;
		if(DoButton_Ex(&s_CwButton, "CW", Enabled, &Button, 0, "[T] Rotates the brush clockwise", CUIRect::CORNER_R) || Input()->KeyPress(KEY_T))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushRotate(s_RotationAmount/360.0f*pi*2);
		}
	}

	// quad manipulation
	{
		// do add button
		TB_Top.VSplitLeft(10.0f, &Button, &TB_Top);
		TB_Top.VSplitLeft(60.0f, &Button, &TB_Top);
		static int s_NewButton = 0;

		CLayerQuads *pQLayer = (CLayerQuads *)GetSelectedLayerType(0, LAYERTYPE_QUADS);
		//CLayerTiles *tlayer = (CLayerTiles *)get_selected_layer_type(0, LAYERTYPE_TILES);
		if(DoButton_Editor(&s_NewButton, "Add Quad", pQLayer?0:-1, &Button, 0, "Adds a new quad"))
		{
			if(pQLayer)
			{
				float Mapping[4];
				CLayerGroup *g = GetSelectedGroup();
				g->Mapping(Mapping);
				int AddX = f2fx(Mapping[0] + (Mapping[2]-Mapping[0])/2);
				int AddY = f2fx(Mapping[1] + (Mapping[3]-Mapping[1])/2);

				CQuad *q = pQLayer->NewQuad();
				for(int i = 0; i < 5; i++)
				{
					q->m_aPoints[i].x += AddX;
					q->m_aPoints[i].y += AddY;
				}
			}
		}
	}

	// tile manipulation
	{
		TB_Bottom.VSplitLeft(40.0f, &Button, &TB_Bottom);
		static int s_BorderBut = 0;
		CLayerTiles *pT = (CLayerTiles *)GetSelectedLayerType(0, LAYERTYPE_TILES);

		if(DoButton_Editor(&s_BorderBut, "Border", pT?0:-1, &Button, 0, "Adds border tiles"))
		{
			if(pT)
				DoMapBorder();
		}
	}

	TB_Bottom.VSplitLeft(5.0f, 0, &TB_Bottom);

	// refocus button
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_RefocusButton = 0;
	if(DoButton_Editor(&s_RefocusButton, "Refocus", m_WorldOffsetX&&m_WorldOffsetY?0:-1, &Button, 0, "[HOME] Restore map focus") || (m_EditBoxActive == 0 && Input()->KeyPress(KEY_HOME)))
	{
		m_WorldOffsetX = 0;
		m_WorldOffsetY = 0;
	}

	TB_Bottom.VSplitLeft(5.0f, 0, &TB_Bottom);

	// grid button
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_GridButton = 0;
	if(DoButton_Editor(&s_GridButton, "Grid", m_GridActive, &Button, 0, "Toggle Grid"))
	{
		m_GridActive = !m_GridActive;
	}

	TB_Bottom.VSplitLeft(30.0f, 0, &TB_Bottom);

	// grid zoom
	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);
	static int s_GridIncreaseButton = 0;
	if(DoButton_Ex(&s_GridIncreaseButton, "G-", 0, &Button, 0, "Decrease grid", CUIRect::CORNER_L))
	{
		if(m_GridFactor > 1)
			m_GridFactor--;
	}

	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);
	static int s_GridNormalButton = 0;
	if(DoButton_Ex(&s_GridNormalButton, "1", 0, &Button, 0, "Normal grid", 0))
		m_GridFactor = 1;

	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);

	static int s_GridDecreaseButton = 0;
	if(DoButton_Ex(&s_GridDecreaseButton, "G+", 0, &Button, 0, "Increase grid", CUIRect::CORNER_R))
	{
		if(m_GridFactor < 15)
			m_GridFactor++;
	}

	TB_Bottom.VSplitLeft(10.0f, 0, &TB_Bottom);

	// pipette / color picking
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_ColorPickingButton = 0;
	if(DoButton_Editor(&s_ColorPickingButton, "Pipette", m_MouseEdMode == MOUSE_PIPETTE, &Button, 0, "Pick color from view"))
	{
		// toggle mouse mode
		if(m_MouseEdMode == MOUSE_PIPETTE)
			m_MouseEdMode = MOUSE_EDIT;
		else
			m_MouseEdMode = MOUSE_PIPETTE;
	}

	// display selected color
	if(m_SelectedColor.a > 0.0f)
	{
		TB_Bottom.VSplitLeft(4.0f, 0, &TB_Bottom);

		TB_Bottom.VSplitLeft(24.0f, &Button, &TB_Bottom);
		Button.Draw(m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	}

}